

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::execute_positive_test
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,string *vertex_shader_source,
          string *tess_ctrl_shader_source,string *tess_eval_shader_source,
          string *geometry_shader_source,string *fragment_shader_source,
          string *compute_shader_source,bool delete_generated_objects,bool require_gpu_shader5)

{
  _func_int *p_Var1;
  size_type sVar2;
  int iVar3;
  GLint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar7;
  ulong uVar8;
  GLint link_status;
  string *local_48;
  string *local_40;
  size_type local_38;
  long lVar6;
  
  local_48 = geometry_shader_source;
  local_40 = fragment_shader_source;
  iVar3 = (*this->context_id->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  link_status = 1;
  local_38 = compute_shader_source->_M_string_length;
  p_Var1 = (this->super_TestCase).super_TestNode._vptr_TestNode[7];
  uVar8 = (ulong)require_gpu_shader5;
  if (local_38 == 0) {
    uVar7 = (uint)require_gpu_shader5;
    iVar3 = (*p_Var1)(this,local_40,0,uVar8);
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The fragment shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x412);
      goto LAB_00b6f45a;
    }
    iVar3 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(this,local_48,3,(ulong)uVar7)
    ;
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The geometry shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x41d);
      goto LAB_00b6f45a;
    }
    iVar3 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                      (this,tess_eval_shader_source,5,(ulong)uVar7);
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The tesselation evaluation shader was expected to compile successfully, but failed to compile."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x428);
      goto LAB_00b6f45a;
    }
    iVar3 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                      (this,tess_ctrl_shader_source,4,(ulong)uVar7);
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The tesselation control shader was expected to compile successfully, but failed to compile."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x433);
      goto LAB_00b6f45a;
    }
    iVar3 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                      (this,vertex_shader_source,1,uVar8);
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The vertex shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x43e);
      goto LAB_00b6f45a;
    }
  }
  else {
    iVar3 = (*p_Var1)(this,compute_shader_source,2,uVar8);
    if (iVar3 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "The compute shader was expected to compile successfully, but failed to compile.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,1099);
      goto LAB_00b6f45a;
    }
  }
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->program_object_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not create a program object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x455);
  sVar2 = local_38;
  if (local_38 == 0) {
    (**(code **)(lVar6 + 0x10))(this->program_object_id,this->fragment_shader_object_id);
    if (this->geometry_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x10))(this->program_object_id);
    }
    if (this->tess_ctrl_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x10))(this->program_object_id);
    }
    if (this->tess_eval_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x10))(this->program_object_id);
    }
    (**(code **)(lVar6 + 0x10))(this->program_object_id,this->vertex_shader_object_id);
  }
  else {
    (**(code **)(lVar6 + 0x10))(this->program_object_id,this->compute_shader_object_id);
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glAttachShader() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x471);
  if (sVar2 == 0) {
    (**(code **)(lVar6 + 0x470))(this->fragment_shader_object_id);
    if (this->geometry_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x470))();
    }
    if (this->tess_ctrl_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x470))();
    }
    if (this->tess_eval_shader_object_id != 0) {
      (**(code **)(lVar6 + 0x470))();
    }
    (**(code **)(lVar6 + 0x470))(this->vertex_shader_object_id);
  }
  else {
    (**(code **)(lVar6 + 0x470))(this->compute_shader_object_id);
  }
  this->compute_shader_object_id = 0;
  this->fragment_shader_object_id = 0;
  this->geometry_shader_object_id = 0;
  this->tess_ctrl_shader_object_id = 0;
  this->tess_eval_shader_object_id = 0;
  this->vertex_shader_object_id = 0;
  (**(code **)(lVar6 + 0xce8))(this->program_object_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glLinkProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x496);
  (**(code **)(lVar6 + 0x9d8))(this->program_object_id,0x8b82,&link_status);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetProgramiv() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x49a);
  if (link_status == 1) {
    if (delete_generated_objects) {
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    return CONTINUE;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Linking was expected to succeed, but the process was unsuccessful.",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x4bf);
LAB_00b6f45a:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TestCaseBase<API>::execute_positive_test(
	const std::string& vertex_shader_source, const std::string& tess_ctrl_shader_source,
	const std::string& tess_eval_shader_source, const std::string& geometry_shader_source,
	const std::string& fragment_shader_source, const std::string& compute_shader_source, bool delete_generated_objects,
	bool require_gpu_shader5)
{
	glw::GLint			  compile_status = GL_TRUE;
	const glw::Functions& gl			 = context_id.getRenderContext().getFunctions();
	glw::GLint			  link_status	= GL_TRUE;
	bool				  test_compute   = !compute_shader_source.empty();
	bool				  test_result	= true;

	if (false == test_compute)
	{
		/* Compile, and check the compilation result for the fragment shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			fragment_shader_source, TestCaseBase<API>::FRAGMENT_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The fragment shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the geometry shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			geometry_shader_source, TestCaseBase<API>::GEOMETRY_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The geometry shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the te shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			tess_eval_shader_source, TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The tesselation evaluation shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the tc shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			tess_ctrl_shader_source, TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The tesselation control shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}

		/* Compile, and check the compilation result for the vertex shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			vertex_shader_source, TestCaseBase<API>::VERTEX_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The vertex shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}
	}
	else
	{
		/* Compile, and check the compilation result for the compute shader object. */
		compile_status = compile_shader_and_get_compilation_result(
			compute_shader_source, TestCaseBase<API>::COMPUTE_SHADER_TYPE, require_gpu_shader5);

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("The compute shader was expected to compile successfully, but failed to compile.");

			test_result = false;
		}
	}

	if (true == test_result)
	{
		/* Create program object. */
		program_object_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a program object.");

		/* Configure the program object */
		if (false == test_compute)
		{
			gl.attachShader(program_object_id, fragment_shader_object_id);

			if (geometry_shader_object_id)
			{
				gl.attachShader(program_object_id, geometry_shader_object_id);
			}

			if (tess_ctrl_shader_object_id)
			{
				gl.attachShader(program_object_id, tess_ctrl_shader_object_id);
			}

			if (tess_eval_shader_object_id)
			{
				gl.attachShader(program_object_id, tess_eval_shader_object_id);
			}

			gl.attachShader(program_object_id, vertex_shader_object_id);
		}
		else
		{
			gl.attachShader(program_object_id, compute_shader_object_id);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed.");

		if (false == test_compute)
		{
			gl.deleteShader(fragment_shader_object_id);

			if (geometry_shader_object_id)
			{
				gl.deleteShader(geometry_shader_object_id);
			}

			if (tess_ctrl_shader_object_id)
			{
				gl.deleteShader(tess_ctrl_shader_object_id);
			}

			if (tess_eval_shader_object_id)
			{
				gl.deleteShader(tess_eval_shader_object_id);
			}

			gl.deleteShader(vertex_shader_object_id);
		}
		else
		{
			gl.deleteShader(compute_shader_object_id);
		}

		fragment_shader_object_id  = 0;
		vertex_shader_object_id	= 0;
		geometry_shader_object_id  = 0;
		tess_ctrl_shader_object_id = 0;
		tess_eval_shader_object_id = 0;
		compute_shader_object_id   = 0;

		/* Link the program object */
		gl.linkProgram(program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed.");

		/* Make sure the linking operation succeeded. */
		gl.getProgramiv(program_object_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed.");

		if (link_status != GL_TRUE)
		{
#if IS_DEBUG
			glw::GLint  length = 0;
			std::string message;

			/* Get error log length */
			gl.getProgramiv(program_object_id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

			message.resize(length, 0);

			/* Get error log */
			gl.getProgramInfoLog(program_object_id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

			context_id.getTestContext().getLog() << tcu::TestLog::Message << "Error message: " << &message[0]
												 << tcu::TestLog::EndMessage;

#if IS_DEBUG_DUMP_ALL_SHADERS
			if (false == test_compute)
			{
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(vertex_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(tess_ctrl_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(tess_eval_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(geometry_shader_source);
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(fragment_shader_source);
			}
			else
			{
				context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(compute_shader_source);
			}
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */
#endif /* IS_DEBUG */

			TCU_FAIL("Linking was expected to succeed, but the process was unsuccessful.");

			test_result = false;
		}
	}

	if (delete_generated_objects)
	{
		/* Deallocate any resources used. */
		this->delete_objects();
	}

	/* Return test pass if true. */
	if (true == test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return CONTINUE;
}